

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b6a8b::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite)

{
  int iVar1;
  ostream *poVar2;
  char *__filename;
  uint *puVar3;
  reference pvVar4;
  Array2D<void_*> *pAVar5;
  void *pvVar6;
  void **ppvVar7;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  int k_2;
  int j_2;
  int i_5;
  uint l_1;
  int k_1;
  int j_1;
  int i_4;
  uint l;
  int k;
  int j;
  int i_3;
  int pointerSize;
  int sampleSize;
  string str_1;
  stringstream ss_1;
  PixelType type_1;
  int i_2;
  DeepFrameBuffer frameBuffer;
  DeepScanLineOutputFile file;
  int i_1;
  Array<Imf_2_5::Array2D<void_*>_> data;
  string str;
  stringstream ss;
  int type;
  int i;
  float in_stack_fffffffffffff85c;
  undefined4 in_stack_fffffffffffff860;
  undefined4 uVar8;
  int in_stack_fffffffffffff864;
  undefined4 in_stack_fffffffffffff868;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff86c;
  undefined4 in_stack_fffffffffffff870;
  undefined4 uVar10;
  Compression in_stack_fffffffffffff874;
  long in_stack_fffffffffffff878;
  DeepFrameBuffer *in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  Box2i *in_stack_fffffffffffff890;
  Box2i *in_stack_fffffffffffff898;
  Header *in_stack_fffffffffffff8a0;
  size_t in_stack_fffffffffffff8a8;
  char *in_stack_fffffffffffff8b0;
  Header *in_stack_fffffffffffff8b8;
  Header *in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  string *in_stack_fffffffffffff9e8;
  Header *in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  char *in_stack_fffffffffffffa88;
  DeepScanLineOutputFile *in_stack_fffffffffffffa90;
  int local_52c;
  int local_528;
  int local_524;
  uint local_520;
  int local_51c;
  int local_518;
  int local_514;
  uint local_510;
  int local_50c;
  int local_508;
  int local_504;
  int in_stack_fffffffffffffb0c;
  DeepScanLineOutputFile *in_stack_fffffffffffffb10;
  string local_4c0 [32];
  stringstream local_4a0 [16];
  undefined1 local_490 [376];
  undefined4 local_318;
  int local_314;
  Slice local_310 [3];
  int local_25c;
  Array local_258 [16];
  Channel local_248;
  Channel local_238;
  Channel local_228;
  string local_218 [32];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [16];
  DeepFrameBuffer *in_stack_fffffffffffffe28;
  DeepScanLineOutputFile *in_stack_fffffffffffffe30;
  int local_68;
  Vec2<float> local_58 [8];
  byte local_11;
  int local_10;
  int local_c;
  
  local_11 = in_CL & 1;
  local_10 = in_EDX;
  local_c = in_ESI;
  poVar2 = std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Imath_2_5::Vec2<float>::Vec2(local_58,0.0,0.0);
  Imf_2_5::Header::Header
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
             (float)((ulong)in_stack_fffffffffffff888 >> 0x20),(V2f *)in_stack_fffffffffffff880,
             (float)((ulong)in_stack_fffffffffffff878 >> 0x20),(LineOrder)in_stack_fffffffffffff878,
             in_stack_fffffffffffff874);
  Imf_2_5::Header::operator=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  Imf_2_5::Header::~Header((Header *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  poVar2 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1719ad);
  for (local_68 = 0; local_68 < local_c; local_68 = local_68 + 1) {
    iVar1 = random_int(in_stack_fffffffffffff864);
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::ostream::operator<<(local_1e8,local_68);
    std::__cxx11::stringstream::str();
    if (iVar1 == 0) {
      Imf_2_5::Header::channels((Header *)0x171a31);
      Imf_2_5::Channel::Channel(&local_228,UINT,1,1,false);
      Imf_2_5::ChannelList::insert
                ((ChannelList *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                 (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                 (Channel *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    }
    if (iVar1 == 1) {
      Imf_2_5::Header::channels((Header *)0x171af3);
      Imf_2_5::Channel::Channel(&local_238,HALF,1,1,false);
      Imf_2_5::ChannelList::insert
                ((ChannelList *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                 (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                 (Channel *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    }
    if (iVar1 == 2) {
      Imf_2_5::Header::channels((Header *)0x171b4f);
      Imf_2_5::Channel::Channel(&local_248,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert
                ((ChannelList *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                 (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                 (Channel *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868)
              );
    std::__cxx11::string::~string(local_218);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  Imf_2_5::Header::setType(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array
            ((Array<Imf_2_5::Array2D<void_*>_> *)in_stack_fffffffffffff8c0,
             (long)in_stack_fffffffffffff8b8);
  for (local_25c = 0; iVar1 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20), local_25c < local_c;
      local_25c = local_25c + 1) {
    Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
    Imf_2_5::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  }
  Imf_2_5::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::c_str();
  Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
             (Header *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),iVar1);
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff880);
  puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                     ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,0);
  uVar9 = 0;
  uVar8 = 0;
  Imf_2_5::Slice::Slice
            (local_310,UINT,
             (char *)(puVar3 + (-(long)(anonymous_namespace)::dataWindow -
                               (long)(DAT_00564c3c * 0x111))),4,0x444,1,1,0.0,false,false);
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (Slice *)CONCAT44(in_stack_fffffffffffff86c,uVar9));
  for (local_314 = 0; local_314 < local_c; local_314 = local_314 + 1) {
    local_318 = 3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_314);
    if (*pvVar4 == 0) {
      local_318 = 0;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_314);
    if (*pvVar4 == 1) {
      local_318 = 1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_314);
    if (*pvVar4 == 2) {
      local_318 = 2;
    }
    std::__cxx11::stringstream::stringstream(local_4a0);
    std::ostream::operator<<(local_490,local_314);
    std::__cxx11::stringstream::str();
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
               (long)local_314);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
               (long)local_314);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
               (long)local_314);
    pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
    Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_314,0);
    uVar10 = 0;
    uVar9 = 0;
    uVar8 = 1;
    Imf_2_5::DeepSlice::DeepSlice
              ((DeepSlice *)in_stack_fffffffffffff8c0,
               (PixelType)((ulong)in_stack_fffffffffffff8b8 >> 0x20),in_stack_fffffffffffff8b0,
               in_stack_fffffffffffff8a8,(size_t)in_stack_fffffffffffff8a0,
               (size_t)in_stack_fffffffffffff898,(int)in_stack_fffffffffffff8d0,
               (int)in_stack_fffffffffffff8d8,(double)in_stack_fffffffffffff890,
               SUB81((ulong)in_stack_fffffffffffff888 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff888 >> 0x30,0));
    Imf_2_5::DeepFrameBuffer::insert
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff874,uVar10),
               (string *)CONCAT44(in_stack_fffffffffffff86c,uVar9),
               (DeepSlice *)CONCAT44(in_stack_fffffffffffff864,uVar8));
    std::__cxx11::string::~string(local_4c0);
    std::__cxx11::stringstream::~stringstream(local_4a0);
  }
  Imf_2_5::DeepScanLineOutputFile::setFrameBuffer
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  poVar2 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  if ((local_11 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"per-line ");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    for (local_514 = 0; local_514 < 0xad; local_514 = local_514 + 1) {
      for (local_518 = 0; local_518 < 0x111; local_518 = local_518 + 1) {
        iVar1 = random_int(in_stack_fffffffffffff864);
        puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                           ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                            (long)local_514);
        puVar3[local_518] = iVar1 + 1;
        for (local_51c = 0; local_51c < local_c; local_51c = local_51c + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_51c);
          if (*pvVar4 == 0) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_514);
            pvVar6 = operator_new__((ulong)puVar3[local_518] << 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
            ppvVar7[local_518] = pvVar6;
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_51c);
          if (*pvVar4 == 1) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_514);
            pvVar6 = operator_new__((ulong)puVar3[local_518] * 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
            ppvVar7[local_518] = pvVar6;
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_51c);
          if (*pvVar4 == 2) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_514);
            pvVar6 = operator_new__((ulong)puVar3[local_518] << 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
            ppvVar7[local_518] = pvVar6;
          }
          for (local_520 = 0;
              puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_514), local_520 < puVar3[local_518];
              local_520 = local_520 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_51c);
            if (*pvVar4 == 0) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
              *(int *)((long)ppvVar7[local_518] + (ulong)local_520 * 4) =
                   (local_514 * 0x111 + local_518) % 0x801;
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_51c);
            if (*pvVar4 == 1) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
              half::operator=((half *)CONCAT44(in_stack_fffffffffffff864,uVar8),
                              in_stack_fffffffffffff85c);
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_51c);
            if (*pvVar4 == 2) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_51c,(long)local_514);
              *(float *)((long)ppvVar7[local_518] + (ulong)local_520 * 4) =
                   (float)((local_514 * 0x111 + local_518) % 0x801);
            }
          }
        }
      }
      Imf_2_5::DeepScanLineOutputFile::writePixels
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"bulk ");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    for (local_504 = 0; local_504 < 0xad; local_504 = local_504 + 1) {
      for (local_508 = 0; local_508 < 0x111; local_508 = local_508 + 1) {
        iVar1 = random_int(in_stack_fffffffffffff864);
        puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                           ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                            (long)local_504);
        puVar3[local_508] = iVar1 + 1;
        for (local_50c = 0; local_50c < local_c; local_50c = local_50c + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_50c);
          if (*pvVar4 == 0) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_504);
            pvVar6 = operator_new__((ulong)puVar3[local_508] << 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
            ppvVar7[local_508] = pvVar6;
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_50c);
          if (*pvVar4 == 1) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_504);
            pvVar6 = operator_new__((ulong)puVar3[local_508] * 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
            ppvVar7[local_508] = pvVar6;
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_50c);
          if (*pvVar4 == 2) {
            puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                (long)local_504);
            pvVar6 = operator_new__((ulong)puVar3[local_508] << 2);
            pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
            ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
            ppvVar7[local_508] = pvVar6;
          }
          for (local_510 = 0;
              puVar3 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_504), local_510 < puVar3[local_508];
              local_510 = local_510 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_50c);
            if (*pvVar4 == 0) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
              *(int *)((long)ppvVar7[local_508] + (ulong)local_510 * 4) =
                   (local_504 * 0x111 + local_508) % 0x801;
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_50c);
            if (*pvVar4 == 1) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
              half::operator=((half *)CONCAT44(in_stack_fffffffffffff864,uVar8),
                              in_stack_fffffffffffff85c);
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_50c);
            if (*pvVar4 == 2) {
              pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
              ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_50c,(long)local_504);
              *(float *)((long)ppvVar7[local_508] + (ulong)local_510 * 4) =
                   (float)((local_504 * 0x111 + local_508) % 0x801);
            }
          }
        }
      }
    }
    Imf_2_5::DeepScanLineOutputFile::writePixels
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
  }
  for (local_524 = 0; local_524 < 0xad; local_524 = local_524 + 1) {
    for (local_528 = 0; local_528 < 0x111; local_528 = local_528 + 1) {
      for (local_52c = 0; local_52c < local_c; local_52c = local_52c + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_52c);
        if (*pvVar4 == 0) {
          pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
          ppvVar7 = Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_52c,(long)local_524);
          if (ppvVar7[local_528] != (void *)0x0) {
            operator_delete__(ppvVar7[local_528]);
          }
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_52c);
        if (*pvVar4 == 1) {
          in_stack_fffffffffffff8a0 = (Header *)Imf_2_5::Array::operator_cast_to_Array2D_(local_258)
          ;
          ppvVar7 = Imf_2_5::Array2D<void_*>::operator[]
                              ((Array2D<void_*> *)
                               ((long)&(in_stack_fffffffffffff8a0->_map)._M_t._M_impl.field_0x0 +
                               (long)local_52c * 3 * 8),(long)local_524);
          if (ppvVar7[local_528] != (void *)0x0) {
            operator_delete__(ppvVar7[local_528]);
          }
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_52c);
        if (*pvVar4 == 2) {
          pAVar5 = Imf_2_5::Array::operator_cast_to_Array2D_(local_258);
          in_stack_fffffffffffff880 =
               (DeepFrameBuffer *)
               Imf_2_5::Array2D<void_*>::operator[](pAVar5 + local_52c,(long)local_524);
          pvVar6 = *(void **)((long)&(in_stack_fffffffffffff880->_map)._M_t._M_impl.field_0x0 +
                             (long)local_528 * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
        }
      }
    }
  }
  Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x172fd7);
  Imf_2_5::DeepScanLineOutputFile::~DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)in_stack_fffffffffffff8a0);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array
            ((Array<Imf_2_5::Array2D<void_*>_> *)in_stack_fffffffffffff880);
  return;
}

Assistant:

void generateRandomFile (const std::string filename,
                         int channelCount,
                         Compression compression,
                         bool bulkWrite)
{
    cout << "generating " << flush;
    header = Header(displayWindow, dataWindow,
                    1,
                    IMATH_NAMESPACE::V2f (0, 0),
                    1,
                    INCREASING_Y,
                    compression);

    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear();

    for (int i = 0; i < channelCount; i++)
    {
        int type = random_int(3);
        stringstream ss;
        ss << i;
        string str = ss.str();
        if (type == 0)
            header.channels().insert(str, Channel(IMF::UINT));
        if (type == 1)
            header.channels().insert(str, Channel(IMF::HALF));
        if (type == 2)
            header.channels().insert(str, Channel(IMF::FLOAT));
        channelTypes.push_back(type);
    }

    header.setType(DEEPSCANLINE);

    Array<Array2D< void* > > data(channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase(height, width);

    sampleCount.resizeErase(height, width);

    remove (filename.c_str());
    DeepScanLineOutputFile file(filename.c_str(), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&sampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),  // base
                                        sizeof (unsigned int) * 1,          // xStride
                                        sizeof (unsigned int) * width));    // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0)
            type = IMF::UINT;
        if (channelTypes[i] == 1)
            type = IMF::HALF;
        if (channelTypes[i] == 2)
            type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof(char *);

        frameBuffer.insert (str,                            // name // 6
                            DeepSlice (type,                    // type // 7
                            (char *) (&data[i][0][0]
                                      - dataWindow.min.x
                                      - dataWindow.min.y * width),               // base // 8
                            pointerSize * 1,          // xStride// 9
                            pointerSize * width,      // yStride// 10
                            sampleSize));             // sampleStride
    }

    file.setFrameBuffer(frameBuffer);

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
        }

        file.writePixels(height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
            file.writePixels(1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    delete[] (unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1)
                    delete[] (half*) data[k][i][j];
                if (channelTypes[k] == 2)
                    delete[] (float*) data[k][i][j];
            }
}